

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_init(proxy_handle *ph)

{
  int local_24;
  void *pvStack_20;
  int ret;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  pvStack_20 = ph->priv;
  if (pvStack_20 == (void *)0x0) {
    pvStack_20 = calloc(1,0x898);
    if (pvStack_20 == (void *)0x0) {
      return -0xc;
    }
    ph->priv = pvStack_20;
  }
  local_24 = rand_init();
  if (((-1 < local_24) &&
      (local_24 = log_init((log_handle *)((long)pvStack_20 + 0x860)), -1 < local_24)) &&
     (local_24 = conf_init(&ph->conf), -1 < local_24)) {
    *(undefined4 *)((long)pvStack_20 + 0x858) = 0;
    local_24 = conn_init((conn_handle *)((long)pvStack_20 + 0x840));
    if (((-1 < local_24) &&
        (local_24 = registration_service_init
                              ((registration_service_handle *)((long)pvStack_20 + 0x888)),
        -1 < local_24)) &&
       ((local_24 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x870)), -1 < local_24 &&
        ((local_24 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x878)), -1 < local_24 &&
         (local_24 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x880)), -1 < local_24)))))) {
      return 0;
    }
  }
  proxy_free(ph);
  return local_24;
}

Assistant:

int proxy_init(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		ph->priv = priv;
	}

	/* Initialize RNG */
	ret = rand_init();
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize log */
	ret = log_init(&priv->log);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize config */
	ret = conf_init(&ph->conf);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize communications */
	priv->conn_listen.type = CONN_TYPE_TCP;
	ret = conn_init(&priv->conn_listen);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize registration service */
	ret = registration_service_init(&priv->reg_service);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the usable_clients mutex */
	ret = mutex_init(&priv->usable_clients_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the idle_clients mutex */
	ret = mutex_init(&priv->idle_clients_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the idle_workers mutex */
	ret = mutex_init(&priv->idle_workers_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	return 0;

proxy_init_exit:
	proxy_free(ph);

	return ret;
}